

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O1

tuple<int,_int>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<boost::range_detail::integer_iterator<int>>&,boost::iterator_range<boost::range_detail::integer_iterator<int>>&>>
          (_Tuple_impl<0UL,_int,_int> param_1,undefined8 param_2,undefined8 *param_3)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)param_3[1];
  if ((iVar1 != ((int *)param_3[1])[1]) && (iVar2 = *(int *)*param_3, iVar2 != ((int *)*param_3)[1])
     ) {
    *(int *)param_1 = iVar2;
    *(int *)((long)param_1 + 4) = iVar1;
    return (tuple<int,_int>)param_1;
  }
  __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                "reference boost::iterator_range_detail::iterator_range_base<boost::range_detail::integer_iterator<int>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = boost::range_detail::integer_iterator<int>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
               );
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }